

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void opj_j2k_copy_tile_quantization_parameters(opj_j2k_t *p_j2k)

{
  opj_tccp_t *poVar1;
  opj_tccp_t *poVar2;
  opj_tcp_t *local_48;
  opj_tccp_t *poStack_38;
  OPJ_UINT32 l_size;
  opj_tccp_t *l_copied_tccp;
  opj_tccp_t *l_ref_tccp;
  opj_tcp_t *l_tcp;
  opj_cp_t *l_cp;
  OPJ_UINT32 i;
  opj_j2k_t *p_j2k_local;
  
  if (p_j2k != (opj_j2k_t *)0x0) {
    if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
      local_48 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
    }
    else {
      local_48 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
    }
    poVar1 = local_48->tccps;
    poVar2 = poVar1;
    for (l_cp._4_4_ = 1; poStack_38 = poVar2 + 1, l_cp._4_4_ < p_j2k->m_private_image->numcomps;
        l_cp._4_4_ = l_cp._4_4_ + 1) {
      poVar2[1].qntsty = poVar1->qntsty;
      poVar2[1].numgbits = poVar1->numgbits;
      memcpy(poVar2[1].stepsizes,poVar1->stepsizes,0x308);
      poVar2 = poStack_38;
    }
    return;
  }
  __assert_fail("p_j2k != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                ,0x27c5,"void opj_j2k_copy_tile_quantization_parameters(opj_j2k_t *)");
}

Assistant:

static void opj_j2k_copy_tile_quantization_parameters(opj_j2k_t *p_j2k)
{
    OPJ_UINT32 i;
    opj_cp_t *l_cp = NULL;
    opj_tcp_t *l_tcp = NULL;
    opj_tccp_t *l_ref_tccp = NULL;
    opj_tccp_t *l_copied_tccp = NULL;
    OPJ_UINT32 l_size;

    /* preconditions */
    assert(p_j2k != 00);

    l_cp = &(p_j2k->m_cp);
    l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
            &l_cp->tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;

    l_ref_tccp = &l_tcp->tccps[0];
    l_copied_tccp = l_ref_tccp + 1;
    l_size = OPJ_J2K_MAXBANDS * sizeof(opj_stepsize_t);

    for (i = 1; i < p_j2k->m_private_image->numcomps; ++i) {
        l_copied_tccp->qntsty = l_ref_tccp->qntsty;
        l_copied_tccp->numgbits = l_ref_tccp->numgbits;
        memcpy(l_copied_tccp->stepsizes, l_ref_tccp->stepsizes, l_size);
        ++l_copied_tccp;
    }
}